

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

string * __thiscall Matrix::sName_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->sMatrixName);
  return __return_storage_ptr__;
}

Assistant:

string Matrix::sName()
{
	return string(sMatrixName);
}